

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureCubeLodControlCase::init
          (TextureCubeLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  TextureCube *this_00;
  RenderContext *context;
  TextureCube *pTVar1;
  PixelBufferAccess *access;
  TextureCubeLodControlCase *pTVar2;
  RGBA local_54;
  Vec4 local_50;
  uint local_40;
  uint local_3c;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int faceNdx;
  int local_18;
  undefined4 local_14;
  int numLevels;
  deUint32 format;
  TextureCubeLodControlCase *this_local;
  
  local_14 = 0x8058;
  _numLevels = this;
  local_18 = deLog2Floor32(this->m_texSize);
  local_18 = local_18 + 1;
  this_00 = (TextureCube *)operator_new(0x180);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TextureCube::TextureCube(this_00,context,0x8058,this->m_texSize);
  this->m_texture = this_00;
  step = 0;
  pTVar2 = this;
  while ((int)step < 6) {
    for (inc = 0; (int)inc < local_18; inc = inc + 1) {
      dec = (deUint32)(0xff / (long)(local_18 + -1));
      rgb = ::deClamp32(dec * inc,0,0xff);
      color = 0xff - rgb;
      local_3c = 0;
      switch(step) {
      case 0:
        local_3c = rgb << 0x10 | color * 0x100 | 0xff;
        break;
      case 1:
        local_3c = rgb << 8 | 0xff0000 | color;
        break;
      case 2:
        local_3c = color * 0x10000 | 0xff00 | rgb;
        break;
      case 3:
        local_3c = color * 0x10000 | rgb << 8 | 0xff;
        break;
      case 4:
        local_3c = color * 0x100 | 0xff0000 | rgb;
        break;
      case 5:
        local_3c = rgb << 0x10 | 0xff00 | color;
      }
      local_40 = local_3c | 0xff000000;
      pTVar1 = glu::TextureCube::getRefTexture(this->m_texture);
      tcu::TextureCube::allocLevel(pTVar1,step,inc);
      pTVar1 = glu::TextureCube::getRefTexture(this->m_texture);
      access = tcu::TextureCube::getLevelFace(pTVar1,inc,step);
      tcu::RGBA::RGBA(&local_54,local_40);
      tcu::RGBA::toVec((RGBA *)&local_50);
      tcu::clear(access,&local_50);
    }
    step = step + 1;
    pTVar2 = (TextureCubeLodControlCase *)(ulong)step;
  }
  return (int)pTVar2;
}

Assistant:

void TextureCubeLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	const int		numLevels	= deLog2Floor32(m_texSize)+1;

	m_texture = new glu::TextureCube(m_context.getRenderContext(), format, m_texSize);

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}